

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

int __thiscall mp::ReadError::init(ReadError *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  char *extraout_RAX;
  char *pcVar2;
  uint in_ECX;
  uint in_EDX;
  int in_R8D;
  void *in_stack_00000008;
  size_t in_stack_00000010;
  MemoryWriter w;
  allocator<char> local_291;
  int local_290;
  string local_288;
  ulong local_268;
  BasicWriter<char> local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  pcVar2 = (char *)(this->filename_)._M_string_length;
  local_290 = in_R8D;
  strlen((char *)ctx);
  std::__cxx11::string::_M_replace((ulong)&this->filename_,0,pcVar2,(ulong)ctx);
  this->line_ = in_EDX;
  this->column_ = in_ECX;
  local_258.buffer_ = &local_248;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0015ab18;
  local_248.ptr_ = local_228;
  local_248.size_ = 0;
  local_248.capacity_ = 500;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_0015ab60;
  local_288.field_2._M_allocated_capacity = (size_type)in_EDX;
  local_268 = (ulong)in_ECX;
  local_288._M_dataplus._M_p = (pointer)ctx;
  fmt::BasicWriter<char>::write(&local_258,0x146694,(void *)0x22a,(size_t)&local_288);
  fmt::BasicWriter<char>::write(&local_258,local_290,in_stack_00000008,in_stack_00000010);
  sVar1 = (local_258.buffer_)->size_;
  if ((local_258.buffer_)->capacity_ < sVar1 + 1) {
    (**(local_258.buffer_)->_vptr_Buffer)();
  }
  (local_258.buffer_)->ptr_[sVar1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,(local_258.buffer_)->ptr_,&local_291);
  Error::SetMessage(&this->super_Error,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0015ab18;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_0015ab60;
  pcVar2 = local_228;
  if (local_248.ptr_ != pcVar2) {
    operator_delete(local_248.ptr_,local_248.capacity_);
    pcVar2 = extraout_RAX;
  }
  return (int)pcVar2;
}

Assistant:

void mp::ReadError::init(fmt::CStringRef filename, int line, int column,
                         fmt::CStringRef format_str, fmt::ArgList args) {
  filename_ = filename.c_str();
  line_ = line;
  column_ = column;
  fmt::MemoryWriter w;
  w.write("{}:{}:{}: ", filename, line, column);
  w.write(format_str, args);
  SetMessage(w.c_str());
}